

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSetPagerFlags(Btree *p,uint pgFlags)

{
  undefined8 *puVar1;
  uint in_ESI;
  long in_RDI;
  BtShared *pBt;
  
  puVar1 = *(undefined8 **)(in_RDI + 8);
  sqlite3BtreeEnter((Btree *)0x1a0ba4);
  sqlite3PagerSetFlags((Pager *)*puVar1,in_ESI);
  sqlite3BtreeLeave((Btree *)0x1a0bbe);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPagerFlags(
  Btree *p,              /* The btree to set the safety level on */
  unsigned pgFlags       /* Various PAGER_* flags */
){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetFlags(pBt->pPager, pgFlags);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}